

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O0

route_id __thiscall helics::CoreBroker::getRoute(CoreBroker *this,GlobalFederateId fedid)

{
  bool bVar1;
  pointer pvVar2;
  long in_RDI;
  const_iterator fnd;
  unordered_map<helics::GlobalFederateId,_helics::route_id,_std::hash<helics::GlobalFederateId>,_std::equal_to<helics::GlobalFederateId>,_std::allocator<std::pair<const_helics::GlobalFederateId,_helics::route_id>_>_>
  *in_stack_ffffffffffffffc8;
  route_id *prVar3;
  _Node_iterator_base<std::pair<const_helics::GlobalFederateId,_helics::route_id>,_false> local_28;
  _Node_iterator_base<std::pair<const_helics::GlobalFederateId,_helics::route_id>,_false> local_20;
  BaseType local_18;
  undefined4 local_14;
  GlobalFederateId local_8 [2];
  
  local_14 = 0;
  bVar1 = GlobalFederateId::operator==(local_8,(GlobalBrokerId)0x0);
  if (!bVar1) {
    local_18 = *(BaseType *)(in_RDI + 0x18);
    bVar1 = GlobalFederateId::operator==(local_8,(GlobalBrokerId)local_18);
    if (!bVar1) {
      local_20._M_cur =
           (__node_type *)
           CLI::std::
           unordered_map<helics::GlobalFederateId,_helics::route_id,_std::hash<helics::GlobalFederateId>,_std::equal_to<helics::GlobalFederateId>,_std::allocator<std::pair<const_helics::GlobalFederateId,_helics::route_id>_>_>
           ::find(in_stack_ffffffffffffffc8,(key_type *)0x508f65);
      local_28._M_cur =
           (__node_type *)
           CLI::std::
           unordered_map<helics::GlobalFederateId,_helics::route_id,_std::hash<helics::GlobalFederateId>,_std::equal_to<helics::GlobalFederateId>,_std::allocator<std::pair<const_helics::GlobalFederateId,_helics::route_id>_>_>
           ::end(in_stack_ffffffffffffffc8);
      bVar1 = CLI::std::__detail::operator==(&local_20,&local_28);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        prVar3 = (route_id *)&parent_route_id;
      }
      else {
        pvVar2 = CLI::std::__detail::
                 _Node_const_iterator<std::pair<const_helics::GlobalFederateId,_helics::route_id>,_false,_false>
                 ::operator->((_Node_const_iterator<std::pair<const_helics::GlobalFederateId,_helics::route_id>,_false,_false>
                               *)0x508fa1);
        prVar3 = &pvVar2->second;
      }
      return (route_id)prVar3->rid;
    }
  }
  return (route_id)0;
}

Assistant:

route_id CoreBroker::getRoute(GlobalFederateId fedid) const
{
    if ((fedid == parent_broker_id) || (fedid == higher_broker_id)) {
        return parent_route_id;
    }
    auto fnd = routing_table.find(fedid);
    return (fnd != routing_table.end()) ? fnd->second :
                                          parent_route_id;  // zero is the default route
}